

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
LongLongsEqualFailure::LongLongsEqualFailure
          (LongLongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          cpputest_longlong expected,cpputest_longlong actual,SimpleString *text)

{
  undefined1 local_108 [72];
  SimpleString expectedReported;
  SimpleString local_98;
  undefined1 local_88 [8];
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  size_t local_38;
  cpputest_longlong actual_local;
  cpputest_longlong expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  LongLongsEqualFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__LongLongsEqualFailure_00189aa8;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  ::StringFrom((cpputest_longlong)&eDecimal.bufferSize_);
  ::StringFrom((cpputest_longlong)&actualReported.bufferSize_);
  SimpleString::padStringsToSameLength
            ((SimpleString *)&eDecimal.bufferSize_,(SimpleString *)&actualReported.bufferSize_,' ');
  SimpleString::SimpleString((SimpleString *)&stack0xffffffffffffff58," ");
  SimpleString::operator+(&local_98,(SimpleString *)&eDecimal.bufferSize_);
  BracketsFormattedHexStringFrom((cpputest_longlong)&expectedReported.bufferSize_);
  SimpleString::operator+((SimpleString *)local_88,&local_98);
  SimpleString::~SimpleString((SimpleString *)&expectedReported.bufferSize_);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffff58);
  SimpleString::SimpleString((SimpleString *)(local_108 + 0x20)," ");
  SimpleString::operator+
            ((SimpleString *)(local_108 + 0x30),(SimpleString *)&actualReported.bufferSize_);
  BracketsFormattedHexStringFrom((cpputest_longlong)(local_108 + 0x10));
  SimpleString::operator+((SimpleString *)(local_108 + 0x40),(SimpleString *)(local_108 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x20));
  TestFailure::createButWasString
            ((TestFailure *)local_108,(SimpleString *)this,(SimpleString *)(local_108 + 0x40));
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_108);
  SimpleString::~SimpleString((SimpleString *)local_108);
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x40));
  SimpleString::~SimpleString((SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)&actualReported.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)&eDecimal.bufferSize_);
  return;
}

Assistant:

LongLongsEqualFailure::LongLongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, cpputest_longlong expected, cpputest_longlong actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}